

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall
CTcTokenizer::next_on_line_xlat(CTcTokenizer *this,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  tc_toktyp_t tVar4;
  tok_embed_ctx *in_RCX;
  CTcToken *in_RDX;
  utf8_ptr *in_RSI;
  CTcTokenizer *in_RDI;
  int in_stack_0000004c;
  tok_embed_ctx *in_stack_00000050;
  CTcToken *in_stack_00000058;
  utf8_ptr *in_stack_00000060;
  int in_stack_000000a4;
  tok_embed_ctx *in_stack_000000a8;
  CTcToken *in_stack_000000b0;
  utf8_ptr *in_stack_000000b8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CTcTokenizer *this_00;
  tc_toktyp_t local_4;
  
  this_00 = in_RDI;
  skip_ws_and_markers((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x292655);
  if ((wVar1 == L'\"') || (wVar1 == L'\'')) {
    local_4 = xlat_string(this_00,in_RSI,in_RDX,in_RCX);
  }
  else {
    if (wVar1 == L'>') {
      if ((((in_RCX != (tok_embed_ctx *)0x0) && (iVar2 = tok_embed_ctx::in_expr(in_RCX), iVar2 != 0)
           ) && (iVar2 = tok_embed_ctx::parens
                                   ((tok_embed_ctx *)CONCAT44(wVar1,in_stack_ffffffffffffffd0)),
                iVar2 == 0)) &&
         (wVar1 = utf8_ptr::getch_at((utf8_ptr *)CONCAT44(wVar1,in_stack_ffffffffffffffd0),
                                     (size_t)in_RDI), wVar1 == L'>')) {
        tVar4 = tokenize_string(in_stack_00000060,in_stack_00000058,in_stack_00000050,
                                in_stack_0000004c);
        return tVar4;
      }
    }
    else if ((wVar1 == L'R') &&
            ((wVar3 = utf8_ptr::getch_at((utf8_ptr *)CONCAT44(0x52,in_stack_ffffffffffffffd0),
                                         (size_t)in_RDI), wVar3 == L'\"' ||
             (wVar1 = utf8_ptr::getch_at((utf8_ptr *)CONCAT44(wVar1,in_stack_ffffffffffffffd0),
                                         (size_t)in_RDI), wVar1 == L'\'')))) {
      tVar4 = tokenize_string(in_stack_00000060,in_stack_00000058,in_stack_00000050,
                              in_stack_0000004c);
      return tVar4;
    }
    local_4 = next_on_line(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
  }
  return local_4;
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line_xlat(utf8_ptr *p, CTcToken *tok,
                                            tok_embed_ctx *ec)
{
    /* skip whitespace */
    skip_ws_and_markers(p);

    /* if this is a string, translate escapes */
    switch(p->getch())
    {
    case '"':
    case '\'':
        /* translate the string */
        return xlat_string(p, tok, ec);

    case '>':
        /* if we're in an embedding, check for '>>' */
        if (ec != 0 && ec->in_expr()
            && ec->parens() == 0
            && p->getch_at(1) == '>')
            return tokenize_string(p, tok, ec, FALSE);

        /* use the default case */
        goto do_normal;

    case 'R':
        /* check for a regex string */
        if (p->getch_at(1) == '"' || p->getch_at(1) == '\'')
            return tokenize_string(p, tok, ec, FALSE);

        /* not a regex string - fall through to the default handling */
        
    default:
    do_normal:
        /* for anything else, use the default tokenizer */
        return next_on_line(p, tok, ec, FALSE);
    }
}